

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

libssh2_knownhost * knownhost_to_external(known_host *node)

{
  char *local_20;
  libssh2_knownhost *ext;
  known_host *node_local;
  
  (node->external).magic = 0xdeadcafe;
  (node->external).node = node;
  if ((node->typemask & 0xffffU) == 1) {
    local_20 = node->name;
  }
  else {
    local_20 = (char *)0x0;
  }
  (node->external).name = local_20;
  (node->external).key = node->key;
  (node->external).typemask = node->typemask;
  return &node->external;
}

Assistant:

static struct libssh2_knownhost *knownhost_to_external(struct known_host *node)
{
    struct libssh2_knownhost *ext = &node->external;

    ext->magic = KNOWNHOST_MAGIC;
    ext->node = node;
    ext->name = ((node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) ==
                 LIBSSH2_KNOWNHOST_TYPE_PLAIN) ? node->name : NULL;
    ext->key = node->key;
    ext->typemask = node->typemask;

    return ext;
}